

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.cc
# Opt level: O2

void __thiscall
xLearn::Loss::CalcGradDist
          (Loss *this,DMatrix *matrix,Model *model,vector<float,_std::allocator<float>_> *grad)

{
  index_t iVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> feature_list;
  DMatrix mini_batch;
  
  while( true ) {
    DMatrix::DMatrix(&mini_batch);
    DMatrix::ReAlloc(&mini_batch,(ulong)this->batch_size_,true);
    iVar1 = DMatrix::GetMiniBatch(matrix,this->batch_size_,&mini_batch);
    if (iVar1 == 0) break;
    feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    mini_batch.row_length = iVar1;
    DMatrix::Compress(&mini_batch,&feature_list);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&feature_list.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    DMatrix::~DMatrix(&mini_batch);
  }
  DMatrix::~DMatrix(&mini_batch);
  return;
}

Assistant:

void Loss::CalcGradDist(DMatrix* matrix,
                        Model& model,
                        std::vector<real_t>& grad) {
  for(;;) {
    // Get a mini-batch from current data matrix
    DMatrix mini_batch;
    mini_batch.ReAlloc(batch_size_);
    index_t len = matrix->GetMiniBatch(batch_size_, mini_batch);
    if (len == 0) {
      break;
    }
    mini_batch.row_length = len;
    // Compress the sparse data matrix and sparse model
    // parameter to dense format
    std::vector<index_t> feature_list;
    mini_batch.Compress(feature_list);
    /*
    // Pull the model parameter from parameter server
    store->pull(feature_list, model);

    // Calculate gradient
    this->CalcGrad(matrix, model, grad);

    // Push gradient to the parameter server
    ps->push(grad, feature_list);
    */
  }
}